

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O0

Var Js::JavascriptSet::EntryAdd(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  JavascriptLibrary *this_00;
  double value_00;
  RecyclableObject *local_80;
  JavascriptSet *local_78;
  RecyclableObject *local_60;
  Var value;
  JavascriptSet *set;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x5e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  callInfo_local = (CallInfo)Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar2 = VarIs<Js::JavascriptSet>((Var)callInfo_local);
  if (bVar2) {
    local_78 = UnsafeVarTo<Js::JavascriptSet>((Var)callInfo_local);
  }
  else {
    local_78 = (JavascriptSet *)0x0;
  }
  if (local_78 != (JavascriptSet *)0x0) {
    if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
      this_00 = ScriptContext::GetLibrary(pSVar4);
      local_80 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
    }
    else {
      local_80 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
    }
    local_60 = local_80;
    bVar2 = JavascriptNumber::Is(local_80);
    if (bVar2) {
      value_00 = JavascriptNumber::GetValue(local_80);
      BVar3 = JavascriptNumber::IsNegZero(value_00);
      if (BVar3 != 0) {
        local_60 = (RecyclableObject *)JavascriptNumber::New(0.0,pSVar4);
      }
    }
    Add(local_78,local_60);
    return local_78;
  }
  JavascriptError::ThrowTypeErrorVar(pSVar4,-0x7ff5ec04,L"Set.prototype.add",L"Set");
}

Assistant:

Var JavascriptSet::EntryAdd(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    JavascriptSet* set = JavascriptOperators::TryFromVar<JavascriptSet>(args[0]);
    if (set == nullptr)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Set.prototype.add"), _u("Set"));
    }

    Var value = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();

    if (JavascriptNumber::Is(value) && JavascriptNumber::IsNegZero(JavascriptNumber::GetValue(value)))
    {
        // Normalize -0 to +0
        value = JavascriptNumber::New(0.0, scriptContext);
    }

    set->Add(value);

    return set;
}